

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3DeleteByRowid(Fts3Table *p,sqlite3_value *pRowid,int *pnChng,u32 *aSzDel)

{
  int local_34;
  int local_30;
  int isEmpty;
  int bFound;
  int rc;
  u32 *aSzDel_local;
  int *pnChng_local;
  sqlite3_value *pRowid_local;
  Fts3Table *p_local;
  
  isEmpty = 0;
  local_30 = 0;
  _bFound = aSzDel;
  aSzDel_local = (u32 *)pnChng;
  pnChng_local = (int *)pRowid;
  pRowid_local = (sqlite3_value *)p;
  fts3DeleteTerms(&isEmpty,p,pRowid,aSzDel,&local_30);
  if ((local_30 != 0) && (isEmpty == 0)) {
    local_34 = 0;
    isEmpty = fts3IsEmpty((Fts3Table *)pRowid_local,(sqlite3_value *)pnChng_local,&local_34);
    if (isEmpty == 0) {
      if (local_34 == 0) {
        *aSzDel_local = *aSzDel_local - 1;
        if (pRowid_local[1].zMalloc == (char *)0x0) {
          fts3SqlExec(&isEmpty,(Fts3Table *)pRowid_local,0,(sqlite3_value **)&pnChng_local);
        }
        if (*(char *)((long)&pRowid_local[8].u + 6) != '\0') {
          fts3SqlExec(&isEmpty,(Fts3Table *)pRowid_local,0x13,(sqlite3_value **)&pnChng_local);
        }
      }
      else {
        isEmpty = fts3DeleteAll((Fts3Table *)pRowid_local,1);
        *aSzDel_local = 0;
        memset(_bFound,0,(long)(*(int *)&pRowid_local->xDel + 1) << 3);
      }
    }
  }
  return isEmpty;
}

Assistant:

static int fts3DeleteByRowid(
  Fts3Table *p, 
  sqlite3_value *pRowid, 
  int *pnChng,                    /* IN/OUT: Decrement if row is deleted */
  u32 *aSzDel
){
  int rc = SQLITE_OK;             /* Return code */
  int bFound = 0;                 /* True if *pRowid really is in the table */

  fts3DeleteTerms(&rc, p, pRowid, aSzDel, &bFound);
  if( bFound && rc==SQLITE_OK ){
    int isEmpty = 0;              /* Deleting *pRowid leaves the table empty */
    rc = fts3IsEmpty(p, pRowid, &isEmpty);
    if( rc==SQLITE_OK ){
      if( isEmpty ){
        /* Deleting this row means the whole table is empty. In this case
        ** delete the contents of all three tables and throw away any
        ** data in the pendingTerms hash table.  */
        rc = fts3DeleteAll(p, 1);
        *pnChng = 0;
        memset(aSzDel, 0, sizeof(u32) * (p->nColumn+1) * 2);
      }else{
        *pnChng = *pnChng - 1;
        if( p->zContentTbl==0 ){
          fts3SqlExec(&rc, p, SQL_DELETE_CONTENT, &pRowid);
        }
        if( p->bHasDocsize ){
          fts3SqlExec(&rc, p, SQL_DELETE_DOCSIZE, &pRowid);
        }
      }
    }
  }

  return rc;
}